

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uchar *puVar13;
  uchar *puVar14;
  ulong uVar15;
  bit_cost_t bVar16;
  ulong uVar17;
  lzdecision *plVar18;
  uint *puVar19;
  uint *in_RSI;
  long in_RDI;
  node_state *cur_node;
  lzdecision *pDst_dec;
  int node_index;
  uint lit_total_complexity;
  bit_cost_t lit_total_cost;
  bit_cost_t lit_cost;
  uint match_total_complexity_1;
  bit_cost_t match_total_cost_1;
  node_state *dst_node_2;
  uint match_complexity;
  uint l_1;
  uint match_dist;
  uint end_len;
  uint start_len;
  uint full_match_index;
  uint prev_max_match_len;
  uint match_len;
  dict_match *pMatches;
  uint min_truncate_match_len;
  uint match_total_complexity;
  bit_cost_t match_total_cost;
  node_state *dst_node_1;
  bit_cost_t cost;
  uint len2_match_dist;
  uint num_full_matches;
  uint max_match_len;
  bit_cost_t rep_match_total_cost;
  node_state *dst_node;
  uint l;
  uint rep_match_total_complexity;
  uint8 *pComp;
  uint comp_pos;
  uint dist;
  uint hist_match_len;
  uint rep_match_index;
  uint match_hist_min_match_len;
  uint match_hist_max_len;
  uint8 *pLookahead;
  uint is_match_model_index;
  uint lit_pred0;
  uint cur_node_total_complexity;
  bit_cost_t cur_node_total_cost;
  uint find_dict_size;
  uint max_admissable_match_len;
  node_state *pCur_node;
  bit_cost_t lzdec_bitcosts [258];
  uint match_distances [128];
  uint match_lens [128];
  uint cur_node_index;
  uint cur_lookahead_ofs;
  uint cur_dict_ofs;
  uint lookahead_start_ofs;
  uint bytes_to_parse;
  state *approx_state;
  node_state *pNodes;
  uint in_stack_fffffffffffff268;
  uint in_stack_fffffffffffff26c;
  uint in_stack_fffffffffffff270;
  undefined1 grow_hint;
  uint in_stack_fffffffffffff274;
  state *in_stack_fffffffffffff278;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  undefined8 in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff288;
  uint in_stack_fffffffffffff28c;
  uint in_stack_fffffffffffff290;
  uint uVar20;
  uint in_stack_fffffffffffff2a0;
  CLZBase *in_stack_fffffffffffff2a8;
  state *in_stack_fffffffffffff2b0;
  int in_stack_fffffffffffff2b8;
  uint in_stack_fffffffffffff2bc;
  bit_cost_t *in_stack_fffffffffffff2c0;
  CLZBase *in_stack_fffffffffffff2c8;
  undefined4 in_stack_fffffffffffff2d0;
  uint in_stack_fffffffffffff2d4;
  lzdecision *in_stack_fffffffffffff2e0;
  uint in_stack_fffffffffffff2e8;
  uint local_d14;
  uint local_d04;
  uint local_d00;
  dict_match *local_cf8;
  uint local_cc8;
  uint local_cc4;
  uint local_cb0;
  uint local_c98;
  uint local_c94;
  uint local_c90;
  uint local_c8c;
  long local_c58 [258];
  uint auStack_448 [128];
  uint auStack_248 [131];
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  state_base *local_28;
  uint *local_20;
  uint *local_18;
  bool local_1;
  
  *(undefined1 *)((long)in_RSI + 0xb2a9a) = 0;
  *(undefined1 *)(in_RSI + 0x2caa6) = 1;
  local_20 = in_RSI + 0x1268;
  *(undefined2 *)(in_RSI + 0x1275) = 0xffff;
  in_RSI[0x1272] = 0;
  in_RSI[0x1273] = 0;
  in_RSI[0x1274] = 0;
  local_18 = in_RSI;
  memset(in_RSI + 0x1276,0xff,0x2a000);
  local_28 = (state_base *)(local_18 + 2);
  local_2c = local_18[1];
  uVar6 = search_accelerator::get_lookahead_pos((search_accelerator *)(in_RDI + 0x17d8));
  uVar7 = search_accelerator::get_max_dict_size_mask((search_accelerator *)(in_RDI + 0x17d8));
  local_30 = uVar6 & uVar7;
  local_34 = *local_18;
  local_38 = local_34 - local_30;
  local_3c = 0;
  while (puVar19 = local_20, uVar4 = local_3c, local_3c < local_2c) {
    if (local_2c - local_3c < 0x102) {
      uVar20 = local_2c - local_3c;
    }
    else {
      uVar20 = 0x101;
    }
    uVar8 = *(int *)(in_RDI + 0x17fc) + local_38;
    if (local_3c != 0) {
      uVar10 = uVar20;
      state_base::restore_partial_state
                (local_28,(state_base *)(local_20 + (ulong)local_3c * 0xe + 3));
      state_base::partial_advance
                ((state_base *)CONCAT44(uVar10,in_stack_fffffffffffff290),
                 (lzdecision *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
    }
    lVar1 = *(long *)(puVar19 + (ulong)uVar4 * 0xe + 10);
    uVar7 = puVar19[(ulong)uVar4 * 0xe + 0xc];
    uVar9 = state::get_pred_char
                      (in_stack_fffffffffffff278,
                       (search_accelerator *)
                       CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                       in_stack_fffffffffffff26c,in_stack_fffffffffffff268);
    uVar10 = (uVar9 >> 2) + local_28->m_cur_state * 0x40;
    puVar13 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x1800),local_34)
    ;
    local_c8c = 0;
    local_c90 = 1;
    for (local_c94 = 0; local_c94 < 4; local_c94 = local_c94 + 1) {
      local_c98 = 0;
      if (local_28->m_match_hist[local_c94] <= uVar8) {
        puVar14 = vector<unsigned_char>::operator[]
                            ((vector<unsigned_char> *)(in_RDI + 0x1800),
                             (*(int *)(in_RDI + 0x17f4) + local_38) -
                             local_28->m_match_hist[local_c94] & *(uint *)(in_RDI + 0x17f0));
        for (local_c98 = 0; (local_c98 < uVar20 && (puVar14[local_c98] == puVar13[local_c98]));
            local_c98 = local_c98 + 1) {
        }
      }
      if (local_c90 <= local_c98) {
        local_c8c = math::maximum<unsigned_int>(local_c8c,local_c98);
        in_stack_fffffffffffff268 = uVar10;
        state::get_rep_match_costs
                  ((state *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                   (uint)((ulong)in_stack_fffffffffffff2c8 >> 0x20),in_stack_fffffffffffff2c0,
                   in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                   (int)((ulong)in_stack_fffffffffffff2b0 >> 0x20),(uint)in_stack_fffffffffffff2e0);
        uVar11 = uVar7 + local_c94 + 2;
        for (local_cb0 = local_c90; local_cb0 <= local_c98; local_cb0 = local_cb0 + 1) {
          plVar18 = (lzdecision *)(puVar19 + (ulong)uVar4 * 0xe + (ulong)local_cb0 * 0xe);
          uVar15 = lVar1 + local_c58[local_cb0];
          uVar17._0_4_ = plVar18[3].m_len;
          uVar17._4_4_ = plVar18[3].m_dist;
          if ((uVar15 <= uVar17) &&
             ((uVar2._0_4_ = plVar18[3].m_len, uVar2._4_4_ = plVar18[3].m_dist, uVar15 != uVar2 ||
              (uVar11 < (uint)plVar18[4].m_pos)))) {
            *(ulong *)&plVar18[3].m_len = uVar15;
            plVar18[4].m_pos = uVar11;
            *(short *)&plVar18[4].m_len = (short)local_3c;
            state_base::save_partial_state(local_28,(state_base *)(plVar18 + 1));
            lzdecision::init(plVar18,(EVP_PKEY_CTX *)(ulong)local_34);
            plVar18->m_len = local_cb0;
          }
        }
      }
      local_c90 = 2;
    }
    local_cc4 = local_c8c;
    if (local_c8c < *(uint *)(in_RDI + 0x17b8)) {
      if (1 < uVar20) {
        local_cc8 = 0;
        if ((local_c8c < 2) &&
           (uVar9 = search_accelerator::get_len2_match
                              ((search_accelerator *)
                               CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                               (uint)((ulong)in_stack_fffffffffffff280 >> 0x20)), uVar9 != 0)) {
          bVar16 = state::get_len2_match_cost
                             (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,uVar6,
                              in_stack_fffffffffffff2a0,(uint)((ulong)in_RDI >> 0x20));
          uVar17 = lVar1 + bVar16;
          if ((uVar17 < *(ulong *)(puVar19 + (ulong)uVar4 * 0xe + 0x26)) ||
             ((uVar17 == *(ulong *)(puVar19 + (ulong)uVar4 * 0xe + 0x26) &&
              (uVar7 + 7 < puVar19[(ulong)uVar4 * 0xe + 0x28])))) {
            *(ulong *)(puVar19 + (ulong)uVar4 * 0xe + 0x26) = uVar17;
            puVar19[(ulong)uVar4 * 0xe + 0x28] = uVar7 + 7;
            *(short *)(puVar19 + (ulong)uVar4 * 0xe + 0x29) = (short)local_3c;
            state_base::save_partial_state
                      (local_28,(state_base *)(puVar19 + (ulong)uVar4 * 0xe + 0x1f));
            lzdecision::init((lzdecision *)(puVar19 + (ulong)uVar4 * 0xe + 0x1c),
                             (EVP_PKEY_CTX *)(ulong)local_34);
          }
          local_cc4 = 2;
        }
        uVar8 = local_cc4;
        local_cf8 = search_accelerator::find_matches
                              ((search_accelerator *)
                               CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                               (uint)((ulong)in_stack_fffffffffffff280 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff280 >> 0x18,0));
        if (local_cf8 != (dict_match *)0x0) {
          while( true ) {
            uVar12 = dict_match::get_len(local_cf8);
            uVar9 = uVar20;
            if (uVar12 < uVar20) {
              uVar9 = uVar12;
            }
            in_stack_fffffffffffff290 = uVar9;
            if (local_cc4 < uVar9) {
              auStack_248[local_cc8] = uVar9;
              uVar12 = dict_match::get_dist(local_cf8);
              auStack_448[local_cc8] = uVar12;
              local_cc8 = local_cc8 + 1;
              local_cc4 = uVar9;
            }
            bVar5 = dict_match::is_last(local_cf8);
            if (bVar5) break;
            local_cf8 = local_cf8 + 1;
          }
        }
        if (local_cc8 != 0) {
          if (uVar8 < 2) {
            uVar8 = 1;
          }
          local_d00 = uVar8;
          for (local_d04 = 0; in_stack_fffffffffffff28c = uVar8, local_d04 < local_cc8;
              local_d04 = local_d04 + 1) {
            uVar20 = auStack_248[local_d04];
            in_stack_fffffffffffff268 = uVar20;
            in_stack_fffffffffffff270 = uVar10;
            state::get_full_match_costs
                      ((state *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                       in_stack_fffffffffffff2c8,(uint)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
                       (bit_cost_t *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                       (uint)((ulong)in_stack_fffffffffffff2b0 >> 0x20),
                       (int)in_stack_fffffffffffff2b0,(int)in_stack_fffffffffffff2e0,
                       in_stack_fffffffffffff2e8);
            while (local_d14 = local_d00 + 1, local_d14 <= uVar20) {
              in_stack_fffffffffffff2e8 = 7;
              if (8 < local_d14) {
                in_stack_fffffffffffff2e8 = 6;
              }
              in_stack_fffffffffffff2e0 =
                   (lzdecision *)(puVar19 + (ulong)uVar4 * 0xe + (ulong)local_d14 * 0xe);
              uVar17 = lVar1 + local_c58[local_d14];
              in_stack_fffffffffffff2d4 = uVar7 + in_stack_fffffffffffff2e8;
              uVar15._0_4_ = in_stack_fffffffffffff2e0[3].m_len;
              uVar15._4_4_ = in_stack_fffffffffffff2e0[3].m_dist;
              local_d00 = local_d14;
              if ((uVar17 <= uVar15) &&
                 ((uVar3._0_4_ = in_stack_fffffffffffff2e0[3].m_len,
                  uVar3._4_4_ = in_stack_fffffffffffff2e0[3].m_dist, uVar17 != uVar3 ||
                  (in_stack_fffffffffffff2d4 < (uint)in_stack_fffffffffffff2e0[4].m_pos)))) {
                *(ulong *)&in_stack_fffffffffffff2e0[3].m_len = uVar17;
                in_stack_fffffffffffff2e0[4].m_pos = in_stack_fffffffffffff2d4;
                *(short *)&in_stack_fffffffffffff2e0[4].m_len = (short)local_3c;
                state_base::save_partial_state
                          (local_28,(state_base *)(in_stack_fffffffffffff2e0 + 1));
                lzdecision::init(in_stack_fffffffffffff2e0,(EVP_PKEY_CTX *)(ulong)local_34);
              }
            }
            local_d00 = uVar20;
          }
        }
      }
      if (local_cc4 < *(uint *)(in_RDI + 0x17b8)) {
        in_stack_fffffffffffff2c8 =
             (CLZBase *)
             state::get_lit_cost(in_stack_fffffffffffff2b0,
                                 (search_accelerator *)in_stack_fffffffffffff2a8,uVar6,
                                 in_stack_fffffffffffff2a0,(uint)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffff2c0 =
             (bit_cost_t *)
             ((long)(in_stack_fffffffffffff2c8->super_CLZDecompBase).m_lzx_position_base +
             lVar1 + -0xc);
        in_stack_fffffffffffff2bc = uVar7 + 1;
        if ((in_stack_fffffffffffff2c0 < *(bit_cost_t **)(puVar19 + (ulong)uVar4 * 0xe + 0x18)) ||
           ((in_stack_fffffffffffff2c0 == *(bit_cost_t **)(puVar19 + (ulong)uVar4 * 0xe + 0x18) &&
            (in_stack_fffffffffffff2bc < puVar19[(ulong)uVar4 * 0xe + 0x1a])))) {
          *(bit_cost_t **)(puVar19 + (ulong)uVar4 * 0xe + 0x18) = in_stack_fffffffffffff2c0;
          puVar19[(ulong)uVar4 * 0xe + 0x1a] = in_stack_fffffffffffff2bc;
          *(short *)(puVar19 + (ulong)uVar4 * 0xe + 0x1b) = (short)local_3c;
          state_base::save_partial_state
                    (local_28,(state_base *)(puVar19 + (ulong)uVar4 * 0xe + 0x11));
          lzdecision::init((lzdecision *)(puVar19 + (ulong)uVar4 * 0xe + 0xe),
                           (EVP_PKEY_CTX *)(ulong)local_34);
        }
        local_34 = local_34 + 1;
        local_38 = local_38 + 1;
        local_3c = local_3c + 1;
      }
      else {
        local_34 = local_cc4 + local_34;
        local_38 = local_cc4 + local_38;
        local_3c = local_cc4 + local_3c;
      }
    }
    else {
      local_34 = local_c8c + local_34;
      local_38 = local_c8c + local_38;
      local_3c = local_c8c + local_3c;
    }
  }
  bVar5 = vector<lzham::lzcompressor::lzdecision>::try_reserve
                    ((vector<lzham::lzcompressor::lzdecision> *)
                     CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                     in_stack_fffffffffffff26c);
  grow_hint = (undefined1)(in_stack_fffffffffffff270 >> 0x18);
  if (bVar5) {
    uVar6 = local_2c;
    plVar18 = vector<lzham::lzcompressor::lzdecision>::get_ptr
                        ((vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x2caa2));
    do {
      puVar19 = local_20 + (long)(int)uVar6 * 0xe;
      uVar6 = puVar19[1];
      plVar18->m_pos = puVar19[0];
      plVar18->m_len = uVar6;
      plVar18->m_dist = puVar19[2];
      uVar6 = (uint)(short)puVar19[0xd];
      plVar18 = plVar18 + 1;
    } while (0 < (int)uVar6);
    this_00 = (vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x2caa2);
    vector<lzham::lzcompressor::lzdecision>::get_ptr
              ((vector<lzham::lzcompressor::lzdecision> *)(local_18 + 0x2caa2));
    vector<lzham::lzcompressor::lzdecision>::try_resize
              (this_00,in_stack_fffffffffffff274,(bool)grow_hint);
    local_1 = true;
  }
  else {
    *(undefined1 *)((long)local_18 + 0xb2a9a) = 1;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#if 0
      for (uint i = 1; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }
#else
      memset( &pNodes[1], 0xFF, cMaxParseGraphNodes * sizeof(node_state));
#endif

      state &approx_state = parse_state.m_approx_state;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;
               }
            }

            match_hist_min_match_len = cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len); //match_hist_max_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }